

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_arg_test.cc
# Opt level: O2

void re2::REArgTestIntTest(void)

{
  char cVar1;
  char *__s;
  bool bVar2;
  size_t sVar3;
  ostream *poVar4;
  long lVar5;
  int r;
  LogMessageFatal local_1b0;
  
  for (lVar5 = 0x12; lVar5 != 0x26a; lVar5 = lVar5 + 0x18) {
    __s = *(char **)((long)&PTR__GLOBAL__sub_I_re2_arg_test_cc_0014a138 + lVar5 + 6);
    sVar3 = strlen(__s);
    bVar2 = RE2::Arg::parse_int(__s,(int)sVar3,&r);
    cVar1 = *(char *)((long)&kSuccessTable + lVar5);
    if ((bool)cVar1 != bVar2) {
      LogMessageFatal::LogMessageFatal
                (&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_arg_test.cc"
                 ,0x76);
      poVar4 = std::operator<<((ostream *)&local_1b0.super_LogMessage.str_,
                               "Check failed: (retval) == (success)");
      poVar4 = std::operator<<(poVar4,"Parsing \'");
      poVar4 = std::operator<<(poVar4,__s);
      poVar4 = std::operator<<(poVar4,"\' for type int should return ");
      std::ostream::_M_insert<bool>(SUB81(poVar4,0));
      LogMessageFatal::~LogMessageFatal(&local_1b0);
    }
    if ((cVar1 != '\0') && (r != *(int *)((long)&PTR__GLOBAL__sub_I_test_cc_0014a140 + lVar5 + 6)))
    {
      LogMessageFatal::LogMessageFatal
                (&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_arg_test.cc"
                 ,0x76);
      std::operator<<((ostream *)&local_1b0.super_LogMessage.str_,
                      "Check failed: (r) == ((int)kSuccessTable[i].value)");
      LogMessageFatal::~LogMessageFatal(&local_1b0);
    }
  }
  return;
}

Assistant:

TEST(REArgTest, IntTest) {
  PARSE_FOR_TYPE(int, 2);
}

TEST(REArgTest, UInt32Test) {
  PARSE_FOR_TYPE(uint32, 3);
}

TEST(REArgTest, Iint64Test) {
  PARSE_FOR_TYPE(int64, 4);
}

TEST(REArgTest, Uint64Test) {
  PARSE_FOR_TYPE(uint64, 5);
}

}